

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O3

MMDB_entry_data_list_s *
dump_entry_data_list(FILE *stream,MMDB_entry_data_list_s *entry_data_list,int indent,int *status)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  void *__ptr;
  MMDB_entry_data_list_s *entry_data_list_00;
  uint32_t uVar4;
  byte *pbVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  int size;
  char buffer [1024];
  char local_438 [1032];
  
  iVar2 = 7;
  entry_data_list_00 = (MMDB_entry_data_list_s *)0x0;
  switch((entry_data_list->entry_data).type) {
  case 2:
    pcVar9 = mmdb_strndup((entry_data_list->entry_data).field_1.utf8_string,
                          (ulong)(entry_data_list->entry_data).data_size);
    if (pcVar9 == (char *)0x0) {
LAB_001048ad:
      entry_data_list_00 = (MMDB_entry_data_list_s *)0x0;
      iVar2 = 5;
      goto switchD_00104262_caseD_c;
    }
    iVar2 = 0x3ff;
    if (indent < 0x3ff) {
      iVar2 = indent;
    }
    memset(local_438,0x20,(long)iVar2);
    local_438[iVar2] = '\0';
    fputs(local_438,(FILE *)stream);
    fprintf((FILE *)stream,"\"%s\" <utf8_string>\n",pcVar9);
    free(pcVar9);
    goto LAB_0010462a;
  case 3:
    iVar2 = 0x3ff;
    if (indent < 0x3ff) {
      iVar2 = indent;
    }
    memset(local_438,0x20,(long)iVar2);
    local_438[iVar2] = '\0';
    fputs(local_438,(FILE *)stream);
    pcVar9 = (entry_data_list->entry_data).field_1.utf8_string;
    pcVar6 = "%f <double>\n";
    goto LAB_00104620;
  case 4:
    pbVar5 = (entry_data_list->entry_data).field_1.bytes;
    uVar1 = (entry_data_list->entry_data).data_size;
    __ptr = calloc((ulong)(uVar1 * 2 + 1),1);
    if (__ptr != (void *)0x0 && (ulong)uVar1 != 0) {
      uVar8 = 0;
      do {
        sprintf((char *)((uVar8 & 0xffffffff) + (long)__ptr),"%02X",(ulong)*pbVar5);
        uVar8 = uVar8 + 2;
        pbVar5 = pbVar5 + 1;
      } while ((ulong)uVar1 * 2 != uVar8);
    }
    if (__ptr == (void *)0x0) goto LAB_001048ad;
    iVar2 = 0x3ff;
    if (indent < 0x3ff) {
      iVar2 = indent;
    }
    memset(local_438,0x20,(long)iVar2);
    local_438[iVar2] = '\0';
    fputs(local_438,(FILE *)stream);
    fprintf((FILE *)stream,"%s <bytes>\n",__ptr);
    free(__ptr);
    entry_data_list_00 = entry_data_list->next;
    break;
  case 5:
    iVar2 = 0x3ff;
    if (indent < 0x3ff) {
      iVar2 = indent;
    }
    memset(local_438,0x20,(long)iVar2);
    local_438[iVar2] = '\0';
    fputs(local_438,(FILE *)stream);
    uVar8 = (ulong)(entry_data_list->entry_data).field_1.uint16;
    pcVar9 = "%u <uint16>\n";
    goto LAB_0010474d;
  case 6:
    iVar2 = 0x3ff;
    if (indent < 0x3ff) {
      iVar2 = indent;
    }
    memset(local_438,0x20,(long)iVar2);
    local_438[iVar2] = '\0';
    fputs(local_438,(FILE *)stream);
    uVar8 = (ulong)(entry_data_list->entry_data).field_1.pointer;
    pcVar9 = "%u <uint32>\n";
    goto LAB_0010474d;
  case 7:
    uVar4 = (entry_data_list->entry_data).data_size;
    iVar2 = 0x3ff;
    if (indent < 0x3ff) {
      iVar2 = indent;
    }
    sVar7 = (size_t)iVar2;
    memset(local_438,0x20,sVar7);
    local_438[sVar7] = '\0';
    fputs(local_438,(FILE *)stream);
    fwrite("{\n",2,1,(FILE *)stream);
    entry_data_list_00 = entry_data_list->next;
    if (entry_data_list_00 != (MMDB_entry_data_list_s *)0x0 && uVar4 != 0) {
      iVar3 = 0x3fd;
      if (indent < 0x3fd) {
        iVar3 = indent;
      }
      do {
        uVar4 = uVar4 - 1;
        iVar2 = 7;
        if ((entry_data_list_00->entry_data).type != 2) {
LAB_001048be:
          entry_data_list_00 = (MMDB_entry_data_list_s *)0x0;
          goto switchD_00104262_caseD_c;
        }
        pcVar9 = mmdb_strndup((entry_data_list_00->entry_data).field_1.utf8_string,
                              (ulong)(entry_data_list_00->entry_data).data_size);
        if (pcVar9 == (char *)0x0) {
          iVar2 = 5;
          goto LAB_001048be;
        }
        memset(local_438,0x20,(long)iVar3 + 2);
        local_438[(long)iVar3 + 2] = '\0';
        fputs(local_438,(FILE *)stream);
        fprintf((FILE *)stream,"\"%s\": \n",pcVar9);
        free(pcVar9);
        entry_data_list_00 = dump_entry_data_list(stream,entry_data_list_00->next,indent + 4,status)
        ;
        if (*status != 0) {
          return (MMDB_entry_data_list_s *)0x0;
        }
      } while ((uVar4 != 0) && (entry_data_list_00 != (MMDB_entry_data_list_s *)0x0));
    }
    memset(local_438,0x20,sVar7);
    local_438[sVar7] = '\0';
    fputs(local_438,(FILE *)stream);
    fwrite("}\n",2,1,(FILE *)stream);
    iVar2 = 0;
    goto switchD_00104262_caseD_c;
  case 8:
    iVar2 = 0x3ff;
    if (indent < 0x3ff) {
      iVar2 = indent;
    }
    memset(local_438,0x20,(long)iVar2);
    local_438[iVar2] = '\0';
    fputs(local_438,(FILE *)stream);
    uVar8 = (ulong)(entry_data_list->entry_data).field_1.pointer;
    pcVar9 = "%d <int32>\n";
LAB_0010474d:
    fprintf((FILE *)stream,pcVar9,uVar8);
LAB_00104891:
    iVar2 = 0;
    entry_data_list_00 = entry_data_list->next;
    goto switchD_00104262_caseD_c;
  case 9:
    iVar2 = 0x3ff;
    if (indent < 0x3ff) {
      iVar2 = indent;
    }
    memset(local_438,0x20,(long)iVar2);
    local_438[iVar2] = '\0';
    fputs(local_438,(FILE *)stream);
    pcVar9 = (entry_data_list->entry_data).field_1.utf8_string;
    pcVar6 = "%lu <uint64>\n";
    goto LAB_001046b9;
  case 10:
    iVar2 = 0x3ff;
    if (indent < 0x3ff) {
      iVar2 = indent;
    }
    memset(local_438,0x20,(long)iVar2);
    local_438[iVar2] = '\0';
    fputs(local_438,(FILE *)stream);
    fprintf((FILE *)stream,"0x%016lX%016lX <uint128>\n",
            *(undefined8 *)((long)&(entry_data_list->entry_data).field_1 + 8),
            (entry_data_list->entry_data).field_1.utf8_string);
    goto LAB_00104891;
  case 0xb:
    uVar4 = (entry_data_list->entry_data).data_size;
    iVar2 = 0x3ff;
    if (indent < 0x3ff) {
      iVar2 = indent;
    }
    sVar7 = (size_t)iVar2;
    memset(local_438,0x20,sVar7);
    local_438[sVar7] = '\0';
    fputs(local_438,(FILE *)stream);
    fwrite("[\n",2,1,(FILE *)stream);
    entry_data_list_00 = entry_data_list->next;
    if (entry_data_list_00 != (MMDB_entry_data_list_s *)0x0 && uVar4 != 0) {
      do {
        uVar4 = uVar4 - 1;
        entry_data_list_00 = dump_entry_data_list(stream,entry_data_list_00,indent + 2,status);
        if (*status != 0) {
          return (MMDB_entry_data_list_s *)0x0;
        }
      } while ((uVar4 != 0) && (entry_data_list_00 != (MMDB_entry_data_list_s *)0x0));
    }
    memset(local_438,0x20,sVar7);
    local_438[sVar7] = '\0';
    fputs(local_438,(FILE *)stream);
    fwrite("]\n",2,1,(FILE *)stream);
    break;
  default:
    goto switchD_00104262_caseD_c;
  case 0xe:
    iVar2 = 0x3ff;
    if (indent < 0x3ff) {
      iVar2 = indent;
    }
    memset(local_438,0x20,(long)iVar2);
    local_438[iVar2] = '\0';
    fputs(local_438,(FILE *)stream);
    pcVar9 = "false";
    if ((entry_data_list->entry_data).field_1.boolean != false) {
      pcVar9 = "true";
    }
    pcVar6 = "%s <boolean>\n";
LAB_001046b9:
    fprintf((FILE *)stream,pcVar6,pcVar9);
    goto LAB_00104891;
  case 0xf:
    iVar2 = 0x3ff;
    if (indent < 0x3ff) {
      iVar2 = indent;
    }
    memset(local_438,0x20,(long)iVar2);
    local_438[iVar2] = '\0';
    fputs(local_438,(FILE *)stream);
    pcVar9 = (char *)(double)(entry_data_list->entry_data).field_1.float_value;
    pcVar6 = "%f <float>\n";
LAB_00104620:
    fprintf((FILE *)stream,pcVar6,pcVar9);
LAB_0010462a:
    entry_data_list_00 = entry_data_list->next;
  }
  iVar2 = 0;
switchD_00104262_caseD_c:
  *status = iVar2;
  return entry_data_list_00;
}

Assistant:

static MMDB_entry_data_list_s *
dump_entry_data_list(FILE *stream,
                     MMDB_entry_data_list_s *entry_data_list,
                     int indent,
                     int *status) {
    switch (entry_data_list->entry_data.type) {
        case MMDB_DATA_TYPE_MAP: {
            uint32_t size = entry_data_list->entry_data.data_size;

            print_indentation(stream, indent);
            fprintf(stream, "{\n");
            indent += 2;

            for (entry_data_list = entry_data_list->next;
                 size && entry_data_list;
                 size--) {

                if (MMDB_DATA_TYPE_UTF8_STRING !=
                    entry_data_list->entry_data.type) {
                    *status = MMDB_INVALID_DATA_ERROR;
                    return NULL;
                }
                char *key =
                    mmdb_strndup(entry_data_list->entry_data.utf8_string,
                                 entry_data_list->entry_data.data_size);
                if (NULL == key) {
                    *status = MMDB_OUT_OF_MEMORY_ERROR;
                    return NULL;
                }

                print_indentation(stream, indent);
                fprintf(stream, "\"%s\": \n", key);
                free(key);

                entry_data_list = entry_data_list->next;
                entry_data_list = dump_entry_data_list(
                    stream, entry_data_list, indent + 2, status);

                if (MMDB_SUCCESS != *status) {
                    return NULL;
                }
            }

            indent -= 2;
            print_indentation(stream, indent);
            fprintf(stream, "}\n");
        } break;
        case MMDB_DATA_TYPE_ARRAY: {
            uint32_t size = entry_data_list->entry_data.data_size;

            print_indentation(stream, indent);
            fprintf(stream, "[\n");
            indent += 2;

            for (entry_data_list = entry_data_list->next;
                 size && entry_data_list;
                 size--) {
                entry_data_list = dump_entry_data_list(
                    stream, entry_data_list, indent, status);
                if (MMDB_SUCCESS != *status) {
                    return NULL;
                }
            }

            indent -= 2;
            print_indentation(stream, indent);
            fprintf(stream, "]\n");
        } break;
        case MMDB_DATA_TYPE_UTF8_STRING: {
            char *string = mmdb_strndup(entry_data_list->entry_data.utf8_string,
                                        entry_data_list->entry_data.data_size);
            if (NULL == string) {
                *status = MMDB_OUT_OF_MEMORY_ERROR;
                return NULL;
            }
            print_indentation(stream, indent);
            fprintf(stream, "\"%s\" <utf8_string>\n", string);
            free(string);
            entry_data_list = entry_data_list->next;
        } break;
        case MMDB_DATA_TYPE_BYTES: {
            char *hex_string =
                bytes_to_hex(entry_data_list->entry_data.bytes,
                             entry_data_list->entry_data.data_size);

            if (NULL == hex_string) {
                *status = MMDB_OUT_OF_MEMORY_ERROR;
                return NULL;
            }

            print_indentation(stream, indent);
            fprintf(stream, "%s <bytes>\n", hex_string);
            free(hex_string);

            entry_data_list = entry_data_list->next;
        } break;
        case MMDB_DATA_TYPE_DOUBLE:
            print_indentation(stream, indent);
            fprintf(stream,
                    "%f <double>\n",
                    entry_data_list->entry_data.double_value);
            entry_data_list = entry_data_list->next;
            break;
        case MMDB_DATA_TYPE_FLOAT:
            print_indentation(stream, indent);
            fprintf(stream,
                    "%f <float>\n",
                    entry_data_list->entry_data.float_value);
            entry_data_list = entry_data_list->next;
            break;
        case MMDB_DATA_TYPE_UINT16:
            print_indentation(stream, indent);
            fprintf(
                stream, "%u <uint16>\n", entry_data_list->entry_data.uint16);
            entry_data_list = entry_data_list->next;
            break;
        case MMDB_DATA_TYPE_UINT32:
            print_indentation(stream, indent);
            fprintf(
                stream, "%u <uint32>\n", entry_data_list->entry_data.uint32);
            entry_data_list = entry_data_list->next;
            break;
        case MMDB_DATA_TYPE_BOOLEAN:
            print_indentation(stream, indent);
            fprintf(stream,
                    "%s <boolean>\n",
                    entry_data_list->entry_data.boolean ? "true" : "false");
            entry_data_list = entry_data_list->next;
            break;
        case MMDB_DATA_TYPE_UINT64:
            print_indentation(stream, indent);
            fprintf(stream,
                    "%" PRIu64 " <uint64>\n",
                    entry_data_list->entry_data.uint64);
            entry_data_list = entry_data_list->next;
            break;
        case MMDB_DATA_TYPE_UINT128:
            print_indentation(stream, indent);
#if MMDB_UINT128_IS_BYTE_ARRAY
            char *hex_string = bytes_to_hex(
                (uint8_t *)entry_data_list->entry_data.uint128, 16);
            if (NULL == hex_string) {
                *status = MMDB_OUT_OF_MEMORY_ERROR;
                return NULL;
            }
            fprintf(stream, "0x%s <uint128>\n", hex_string);
            free(hex_string);
#else
            uint64_t high = entry_data_list->entry_data.uint128 >> 64;
            uint64_t low = (uint64_t)entry_data_list->entry_data.uint128;
            fprintf(stream,
                    "0x%016" PRIX64 "%016" PRIX64 " <uint128>\n",
                    high,
                    low);
#endif
            entry_data_list = entry_data_list->next;
            break;
        case MMDB_DATA_TYPE_INT32:
            print_indentation(stream, indent);
            fprintf(stream, "%d <int32>\n", entry_data_list->entry_data.int32);
            entry_data_list = entry_data_list->next;
            break;
        default:
            *status = MMDB_INVALID_DATA_ERROR;
            return NULL;
    }

    *status = MMDB_SUCCESS;
    return entry_data_list;
}